

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

uint binsearch(TValue *array,uint i,uint j)

{
  uint uVar1;
  uint local_18;
  uint m;
  uint j_local;
  uint i_local;
  TValue *array_local;
  
  local_18 = j;
  uVar1 = i;
  while (m = uVar1, 1 < local_18 - m) {
    uVar1 = m + local_18 >> 1;
    if ((array[uVar1 - 1].tt_ & 0xf) == 0) {
      local_18 = uVar1;
      uVar1 = m;
    }
  }
  return m;
}

Assistant:

static unsigned int binsearch (const TValue *array, unsigned int i,
                                                    unsigned int j) {
  while (j - i > 1u) {  /* binary search */
    unsigned int m = (i + j) / 2;
    if (isempty(&array[m - 1])) j = m;
    else i = m;
  }
  return i;
}